

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_descriptor.cpp
# Opt level: O3

void __thiscall
cfd::core::DescriptorKeyInfo::DescriptorKeyInfo
          (DescriptorKeyInfo *this,Privkey *privkey,bool use_wif_parameter,NetType net_type,
          bool is_compressed,string *parent_key_information)

{
  undefined3 uVar1;
  NetType NVar2;
  string local_50;
  
  this->key_type_ = kDescriptorKeyPublic;
  SchnorrPubkey::SchnorrPubkey(&this->schnorr_pubkey_);
  Pubkey::Pubkey(&this->pubkey_);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&this->privkey_,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)privkey);
  uVar1 = *(undefined3 *)&privkey->field_0x19;
  NVar2 = privkey->net_type_;
  (this->privkey_).is_compressed_ = privkey->is_compressed_;
  *(undefined3 *)&(this->privkey_).field_0x19 = uVar1;
  (this->privkey_).net_type_ = NVar2;
  ExtPrivkey::ExtPrivkey(&this->extprivkey_);
  ExtPubkey::ExtPubkey(&this->extpubkey_);
  (this->parent_info_)._M_dataplus._M_p = (pointer)&(this->parent_info_).field_2;
  (this->parent_info_)._M_string_length = 0;
  (this->parent_info_).field_2._M_local_buf[0] = '\0';
  (this->path_)._M_dataplus._M_p = (pointer)&(this->path_).field_2;
  (this->path_)._M_string_length = 0;
  (this->path_).field_2._M_local_buf[0] = '\0';
  (this->key_string_)._M_dataplus._M_p = (pointer)&(this->key_string_).field_2;
  (this->key_string_)._M_string_length = 0;
  (this->key_string_).field_2._M_local_buf[0] = '\0';
  if (use_wif_parameter) {
    Privkey::ConvertWif_abi_cxx11_(&local_50,privkey,net_type,is_compressed);
  }
  else {
    Privkey::GetWif_abi_cxx11_(&local_50,privkey);
  }
  ::std::__cxx11::string::operator=((string *)&this->key_string_,(string *)&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if (parent_key_information->_M_string_length != 0) {
    ::std::__cxx11::string::_M_assign((string *)&this->parent_info_);
  }
  return;
}

Assistant:

DescriptorKeyInfo::DescriptorKeyInfo(
    const Privkey& privkey, bool use_wif_parameter, NetType net_type,
    bool is_compressed, const std::string parent_key_information)
    : key_type_(DescriptorKeyType::kDescriptorKeyPublic), privkey_(privkey) {
  if (use_wif_parameter) {
    key_string_ = privkey.ConvertWif(net_type, is_compressed);
  } else {
    key_string_ = privkey.GetWif();
  }
  if (!parent_key_information.empty()) {
    parent_info_ = parent_key_information;
  }
}